

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

bool __thiscall
setup::anon_unknown_0::evaluator::eval_expression(evaluator *this,bool lazy,bool inner)

{
  undefined1 lazy_00;
  byte in_DL;
  byte in_SIL;
  evaluator *in_RDI;
  bool bVar1;
  bool result;
  evaluator *in_stack_00000058;
  bool local_23;
  bool local_13;
  evaluator *this_00;
  
  lazy_00 = in_SIL & 1;
  this_00 = in_RDI;
  local_13 = eval_term(in_RDI,(bool)lazy_00);
  if (!local_13) goto LAB_0016f298;
  do {
    if ((in_DL & 1) == 0) {
      return local_13;
    }
LAB_0016f298:
    do {
      bVar1 = true;
      if (in_RDI->token != op_or) {
        bVar1 = in_RDI->token == identifier;
      }
      if (!bVar1) {
        return local_13;
      }
      if (in_RDI->token == op_or) {
        next(in_stack_00000058);
      }
      bVar1 = eval_term(this_00,(bool)lazy_00);
      local_23 = true;
      if (!bVar1) {
        local_23 = local_13;
      }
      local_13 = local_23;
    } while (local_23 == false);
  } while( true );
}

Assistant:

bool eval_expression(bool lazy, bool inner = true) {
		bool result = eval_term(lazy);
		if(result && !inner) {
			return result;
		}
		while(token == op_or || token == identifier) {
			if(token == op_or) {
				next();
			}
			result = eval_term(lazy || result) || result;
			if(result && !inner) {
				return result;
			}
		}
		return result;
	}